

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall perfetto::base::PeriodicTask::PostNextTask(PeriodicTask *this)

{
  uint32_t uVar1;
  uint uVar2;
  TaskRunner *pTVar3;
  TimeMillis TVar4;
  WeakPtr<perfetto::base::PeriodicTask> weak_this;
  __shared_ptr<perfetto::base::PeriodicTask_*,_(__gnu_cxx::_Lock_policy)2> local_80;
  _Bind<void_(*(perfetto::base::WeakPtr<perfetto::base::PeriodicTask>,_unsigned_int))(perfetto::base::WeakPtr<perfetto::base::PeriodicTask>,_unsigned_int)>
  local_70;
  _Function_base local_50;
  
  uVar1 = (this->args_).period_ms;
  TVar4 = GetWallTimeMs();
  uVar2 = (this->args_).period_ms;
  std::__shared_ptr<perfetto::base::PeriodicTask_*,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_80,
             (__shared_ptr<perfetto::base::PeriodicTask_*,_(__gnu_cxx::_Lock_policy)2> *)
             &this->weak_ptr_factory_);
  pTVar3 = this->task_runner_;
  local_70._M_f = RunTaskAndPostNext;
  std::tuple<perfetto::base::WeakPtr<perfetto::base::PeriodicTask>,_unsigned_int>::
  tuple<perfetto::base::WeakPtr<perfetto::base::PeriodicTask>_&,_unsigned_int_&,_true>
            (&local_70._M_bound_args,(WeakPtr<perfetto::base::PeriodicTask> *)&local_80,
             &this->generation_);
  ::std::function<void()>::
  function<std::_Bind<void(*(perfetto::base::WeakPtr<perfetto::base::PeriodicTask>,unsigned_int))(perfetto::base::WeakPtr<perfetto::base::PeriodicTask>,unsigned_int)>,void>
            ((function<void()> *)&local_50,&local_70);
  (*pTVar3->_vptr_TaskRunner[3])
            (pTVar3,&local_50,(ulong)(uVar1 - (int)(TVar4.__r % (long)(ulong)uVar2)));
  ::std::_Function_base::~_Function_base(&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_70._M_bound_args.
              super__Tuple_impl<0UL,_perfetto::base::WeakPtr<perfetto::base::PeriodicTask>,_unsigned_int>
              .super__Head_base<0UL,_perfetto::base::WeakPtr<perfetto::base::PeriodicTask>,_false>.
              _M_head_impl.handle_.
              super___shared_ptr<perfetto::base::PeriodicTask_*,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
  return;
}

Assistant:

void PeriodicTask::PostNextTask() {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  PERFETTO_DCHECK(args_.period_ms > 0);
  PERFETTO_DCHECK(!timer_fd_);
  uint32_t delay_ms =
      args_.period_ms -
      static_cast<uint32_t>(base::GetWallTimeMs().count() % args_.period_ms);
  auto weak_this = weak_ptr_factory_.GetWeakPtr();
  task_runner_->PostDelayedTask(
      std::bind(PeriodicTask::RunTaskAndPostNext, weak_this, generation_),
      delay_ms);
}